

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileDataSource.h
# Opt level: O2

uint32_t __thiscall libssio::FileDataSource::read4(FileDataSource *this)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  
  uVar1 = fgetc((FILE *)this->f);
  uVar2 = fgetc((FILE *)this->f);
  uVar3 = fgetc((FILE *)this->f);
  iVar4 = fgetc((FILE *)this->f);
  return iVar4 << 0x18 | (uVar3 & 0xff) << 0x10 | (uVar2 & 0xff) << 8 | uVar1 & 0xff;
}

Assistant:

uint32_t read4() override
    {
        unsigned char b0, b1, b2, b3;
        b0 = fgetc(f);
        b1 = fgetc(f);
        b2 = fgetc(f);
        b3 = fgetc(f);
        return (b0 | (b1<<8) | (b2<<16) | (b3<<24));
    }